

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O3

ostream * tchecker::parsing::operator<<(ostream *os,attributes_t *attr)

{
  _Hash_node_base *p_Var1;
  
  if ((attr->_attr)._M_h._M_element_count != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"{",1);
    for (p_Var1 = (attr->_attr)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
        p_Var1 = p_Var1->_M_nxt) {
      if (p_Var1 != (attr->_attr)._M_h._M_before_begin._M_nxt) {
        std::__ostream_insert<char,std::char_traits<char>>(os," : ",3);
      }
      operator<<(os,(attr_t *)p_Var1[5]._M_nxt);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"}",1);
  }
  return os;
}

Assistant:

std::ostream & operator<<(std::ostream & os, tchecker::parsing::attributes_t const & attr)
{
  if (attr.size() == 0)
    return os;

  os << "{";
  for (auto it = attr.begin(); it != attr.end(); ++it) {
    if (it != attr.begin())
      os << " : ";
    os << *it;
  }
  os << "}";
  return os;
}